

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ClipLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_clip(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x294) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x294;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.clip_ = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::ClipLayerParams>(arena);
    (this->layer_).clip_ = (ClipLayerParams *)LVar2;
  }
  return (ClipLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::ClipLayerParams* NeuralNetworkLayer::_internal_mutable_clip() {
  if (!_internal_has_clip()) {
    clear_layer();
    set_has_clip();
    layer_.clip_ = CreateMaybeMessage< ::CoreML::Specification::ClipLayerParams >(GetArenaForAllocation());
  }
  return layer_.clip_;
}